

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O1

void do_test(uv_udp_recv_cb recv_cb,int bind_flags)

{
  int iVar1;
  uint uVar2;
  uv_timer_t *loop;
  uv_loop_t *loop_00;
  uv_udp_send_t *in_RCX;
  long *extraout_RDX;
  undefined8 *extraout_RDX_00;
  int iVar3;
  uv_udp_t *puVar4;
  code *pcVar5;
  uv_timer_t *puVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  uv_udp_t *puVar10;
  uv_udp_send_t *puVar11;
  sockaddr_in addr;
  int addr_len;
  int addr6_len;
  sockaddr_in6 addr6;
  char dst [256];
  undefined1 local_16c [16];
  int local_15c [2];
  undefined1 local_154 [28];
  uv_buf_t local_138;
  uv_buf_t local_128 [16];
  
  pcVar9 = "::0";
  puVar4 = (uv_udp_t *)0x23a3;
  iVar1 = uv_ip6_addr("::0",0x23a3,(sockaddr_in6 *)local_154);
  if (iVar1 == 0) {
    loop = (uv_timer_t *)uv_default_loop();
    puVar4 = &server;
    iVar1 = uv_udp_init((uv_loop_t *)loop,&server);
    if (iVar1 != 0) goto LAB_001852f4;
    puVar10 = &server;
    puVar4 = (uv_udp_t *)local_154;
    iVar1 = uv_udp_bind(&server,(sockaddr *)puVar4,bind_flags);
    loop = (uv_timer_t *)puVar10;
    if (iVar1 != 0) goto LAB_001852f9;
    local_15c[1] = 0x1c;
    puVar10 = &server;
    puVar4 = (uv_udp_t *)local_154;
    iVar1 = uv_udp_getsockname(&server,(sockaddr *)puVar4,local_15c + 1);
    loop = (uv_timer_t *)puVar10;
    if (iVar1 != 0) goto LAB_001852fe;
    puVar4 = (uv_udp_t *)(local_154 + 8);
    loop = (uv_timer_t *)(ulong)(ushort)local_154._0_2_;
    in_RCX = (uv_udp_send_t *)0x100;
    iVar1 = uv_inet_ntop((uint)(ushort)local_154._0_2_,puVar4,(char *)local_128,0x100);
    if (iVar1 != 0) goto LAB_00185303;
    in_RCX = (uv_udp_send_t *)(ulong)(ushort)local_154._2_2_;
    printf("on [%.*s]:%d\n",0x100,local_128);
    puVar10 = &server;
    pcVar5 = alloc_cb;
    iVar1 = uv_udp_recv_start(&server,alloc_cb,recv_cb);
    puVar4 = (uv_udp_t *)pcVar5;
    loop = (uv_timer_t *)puVar10;
    if (iVar1 != 0) goto LAB_00185308;
    loop = (uv_timer_t *)uv_default_loop();
    puVar4 = &client;
    iVar1 = uv_udp_init((uv_loop_t *)loop,&client);
    if (iVar1 != 0) goto LAB_0018530d;
    loop = (uv_timer_t *)0x1b4e3a;
    puVar4 = (uv_udp_t *)0x23a3;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)local_16c);
    if (iVar1 != 0) goto LAB_00185312;
    pcVar5 = (code *)(local_16c + 4);
    loop = (uv_timer_t *)(ulong)(ushort)local_16c._0_2_;
    in_RCX = (uv_udp_send_t *)0x100;
    puVar4 = (uv_udp_t *)pcVar5;
    iVar1 = uv_inet_ntop((uint)(ushort)local_16c._0_2_,pcVar5,(char *)local_128,0x100);
    if (iVar1 != 0) goto LAB_00185317;
    printf("to [%.*s]:%d\n",0x100,local_128,(ulong)(ushort)local_16c._2_2_);
    uVar2 = uv_os_getpid();
    in_RCX = (uv_udp_send_t *)(ulong)(uVar2 & 0xffff);
    pcVar9 = data;
    puVar4 = (uv_udp_t *)0xa;
    iVar1 = snprintf(data,10,"PING%5u");
    loop = (uv_timer_t *)pcVar9;
    if (iVar1 != 9) goto LAB_0018531c;
    local_138 = uv_buf_init(data,9);
    printf("sending %s\n",data);
    puVar11 = &req_;
    puVar4 = &client;
    in_RCX = (uv_udp_send_t *)0x1;
    iVar1 = uv_udp_send(&req_,&client,&local_138,1,(sockaddr *)local_16c,send_cb);
    loop = (uv_timer_t *)puVar11;
    if (iVar1 != 0) goto LAB_00185321;
    local_15c[0] = UV_SIGNAL;
    puVar10 = &client;
    puVar4 = (uv_udp_t *)local_16c;
    iVar1 = uv_udp_getsockname(&client,(sockaddr *)puVar4,local_15c);
    loop = (uv_timer_t *)puVar10;
    if (iVar1 != 0) goto LAB_00185326;
    loop = (uv_timer_t *)(ulong)(ushort)local_16c._0_2_;
    in_RCX = (uv_udp_send_t *)0x100;
    iVar1 = uv_inet_ntop((uint)(ushort)local_16c._0_2_,pcVar5,(char *)local_128,0x100);
    if (iVar1 != 0) goto LAB_0018532b;
    in_RCX = (uv_udp_send_t *)(ulong)(ushort)local_16c._2_2_;
    printf("from [%.*s]:%d\n",0x100,local_128);
    client_port = local_16c._2_2_;
    loop = (uv_timer_t *)uv_default_loop();
    puVar6 = &timeout;
    iVar1 = uv_timer_init((uv_loop_t *)loop,&timeout);
    pcVar5 = (code *)puVar6;
    if (iVar1 != 0) goto LAB_00185330;
    loop = &timeout;
    pcVar5 = timeout_cb;
    in_RCX = (uv_udp_send_t *)0x0;
    iVar1 = uv_timer_start(&timeout,timeout_cb,500,0);
    if (iVar1 != 0) goto LAB_00185335;
    if (close_cb_called != 0) goto LAB_0018533a;
    if (send_cb_called != 0) goto LAB_0018533f;
    if (recv_cb_called != 0) goto LAB_00185344;
    loop = (uv_timer_t *)uv_default_loop();
    pcVar5 = (code *)0x0;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (close_cb_called != 3) goto LAB_00185349;
    loop_00 = uv_default_loop();
    uv_walk(loop_00,close_walk_cb,(void *)0x0);
    pcVar5 = (code *)0x0;
    uv_run(loop_00,UV_RUN_DEFAULT);
    loop = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    do_test_cold_1();
    loop = (uv_timer_t *)pcVar9;
LAB_001852f4:
    do_test_cold_2();
LAB_001852f9:
    do_test_cold_3();
LAB_001852fe:
    do_test_cold_4();
LAB_00185303:
    do_test_cold_5();
LAB_00185308:
    do_test_cold_6();
LAB_0018530d:
    do_test_cold_7();
LAB_00185312:
    do_test_cold_8();
LAB_00185317:
    do_test_cold_9();
LAB_0018531c:
    do_test_cold_10();
LAB_00185321:
    do_test_cold_11();
LAB_00185326:
    pcVar5 = (code *)puVar4;
    do_test_cold_12();
LAB_0018532b:
    do_test_cold_13();
LAB_00185330:
    do_test_cold_14();
LAB_00185335:
    do_test_cold_15();
LAB_0018533a:
    do_test_cold_16();
LAB_0018533f:
    do_test_cold_17();
LAB_00185344:
    do_test_cold_18();
LAB_00185349:
    do_test_cold_19();
  }
  do_test_cold_20();
  if (((loop == &timeout) || ((uv_udp_t *)loop == &server)) || ((uv_udp_t *)loop == &client)) {
    puVar4 = (uv_udp_t *)0x0;
    if (0 < (long)pcVar5) {
      puVar4 = (uv_udp_t *)pcVar5;
    }
    puVar11 = (uv_udp_send_t *)*extraout_RDX;
    printf("got %d %.*s\n",(ulong)pcVar5 & 0xffffffff,puVar4);
    iVar1 = is_from_client((sockaddr *)in_RCX);
    if ((iVar1 == 0) || (in_RCX == (uv_udp_send_t *)0x0 && (uv_udp_t *)pcVar5 == (uv_udp_t *)0x0)) {
      return;
    }
    in_RCX = puVar11;
    if ((uv_udp_t *)pcVar5 != (uv_udp_t *)0x9) goto LAB_001853eb;
    in_RCX = (uv_udp_send_t *)(*(ulong *)*extraout_RDX ^ data._0_8_);
    if ((char)((ulong *)*extraout_RDX)[1] == data[8] && in_RCX == (uv_udp_send_t *)0x0) {
      recv_cb_called = recv_cb_called + 1;
      return;
    }
  }
  else {
    ipv6_recv_ok_cold_1();
LAB_001853eb:
    ipv6_recv_ok_cold_2();
  }
  ipv6_recv_ok_cold_3();
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    run_test_udp_ipv6_only_cold_3();
    return;
  }
  lVar7 = 1;
  do_test(ipv6_recv_fail,1);
  if (recv_cb_called == 0) {
    if (send_cb_called == 1) {
      return;
    }
  }
  else {
    run_test_udp_ipv6_only_cold_1();
  }
  run_test_udp_ipv6_only_cold_2();
  lVar8 = lVar7;
  printf("got %d %.*s\n");
  iVar3 = (int)lVar8;
  puVar11 = in_RCX;
  iVar1 = is_from_client((sockaddr *)in_RCX);
  if ((iVar1 == 0) || ((lVar7 == 0 && (in_RCX == (uv_udp_send_t *)0x0)))) {
    return;
  }
  ipv6_recv_fail_cold_1();
  if (((puVar11 == (uv_udp_send_t *)&timeout) || (puVar11 == (uv_udp_send_t *)&server)) ||
     (puVar11 == (uv_udp_send_t *)&client)) {
    *extraout_RDX_00 = alloc_cb::slab;
    extraout_RDX_00[1] = 0x10000;
    return;
  }
  alloc_cb_cold_1();
  if (puVar11 == &req_) {
    if (((req_.handle == (uv_udp_t *)&timeout) || (req_.handle == &server)) ||
       (req_.handle == &client)) {
      if (iVar3 == 0) {
        send_cb_called = send_cb_called + 1;
        return;
      }
      goto LAB_00185513;
    }
    send_cb_cold_2();
  }
  send_cb_cold_1();
LAB_00185513:
  send_cb_cold_3();
  uv_close((uv_handle_t *)&server,close_cb);
  uv_close((uv_handle_t *)&client,close_cb);
  uv_close((uv_handle_t *)&timeout,close_cb);
  return;
}

Assistant:

static void do_test(uv_udp_recv_cb recv_cb, int bind_flags) {
  struct sockaddr_in6 addr6;
  struct sockaddr_in addr;
  int addr6_len;
  int addr_len;
  uv_buf_t buf;
  char dst[256];
  int r;

  ASSERT(0 == uv_ip6_addr("::0", TEST_PORT, &addr6));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr6, bind_flags);
  ASSERT(r == 0);

  addr6_len = sizeof(addr6);
  ASSERT(uv_udp_getsockname(&server, (struct sockaddr*) &addr6, &addr6_len) == 0);
  ASSERT(uv_inet_ntop(addr6.sin6_family, &addr6.sin6_addr, dst, sizeof(dst)) == 0);
  printf("on [%.*s]:%d\n", (int) sizeof(dst), dst, addr6.sin6_port);

  r = uv_udp_recv_start(&server, alloc_cb, recv_cb);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(uv_inet_ntop(addr.sin_family, &addr.sin_addr, dst, sizeof(dst)) == 0);
  printf("to [%.*s]:%d\n", (int) sizeof(dst), dst, addr.sin_port);

  /* Create some unique data to send */
  ASSERT(9 == snprintf(data, sizeof(data), "PING%5u", uv_os_getpid() & 0xFFFF));
  buf = uv_buf_init(data, 9);
  printf("sending %s\n", data);

  r = uv_udp_send(&req_,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

  addr_len = sizeof(addr);
  ASSERT(uv_udp_getsockname(&client, (struct sockaddr*) &addr, &addr_len) == 0);
  ASSERT(uv_inet_ntop(addr.sin_family, &addr.sin_addr, dst, sizeof(dst)) == 0);
  printf("from [%.*s]:%d\n", (int) sizeof(dst), dst, addr.sin_port);
  client_port = addr.sin_port;

  r = uv_timer_init(uv_default_loop(), &timeout);
  ASSERT(r == 0);

  r = uv_timer_start(&timeout, timeout_cb, 500, 0);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(send_cb_called == 0);
  ASSERT(recv_cb_called == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 3);

  MAKE_VALGRIND_HAPPY();
}